

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

void __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::PushLabel
          (BinaryReaderInterp *this,LabelKind kind,Offset offset,Offset fixup_offset,
          u32 handler_desc_index)

{
  pointer *ppLVar1;
  pointer __src;
  ulong uVar2;
  pointer pLVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 == (this->label_stack_).
                super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __src = (this->label_stack_).
            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)pLVar3 - (long)__src;
    if (__n == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar4 = (long)__n >> 4;
    uVar2 = 1;
    if (pLVar3 != __src) {
      uVar2 = uVar4;
    }
    uVar5 = uVar2 + uVar4;
    if (0x7fffffffffffffe < uVar5) {
      uVar5 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar2,uVar4)) {
      uVar5 = 0x7ffffffffffffff;
    }
    if (uVar5 == 0) {
      pLVar3 = (pointer)0x0;
    }
    else {
      pLVar3 = (pointer)operator_new(uVar5 << 4);
    }
    pLVar3[uVar4].kind = kind;
    pLVar3[uVar4].offset = offset;
    pLVar3[uVar4].fixup_offset = fixup_offset;
    pLVar3[uVar4].handler_desc_index = handler_desc_index;
    if (0 < (long)__n) {
      memmove(pLVar3,__src,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)(this->label_stack_).
                                  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_start = pLVar3;
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pLVar3 + __n + 0x10);
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar3 + uVar5;
  }
  else {
    pLVar3->kind = kind;
    pLVar3->offset = offset;
    pLVar3->fixup_offset = fixup_offset;
    pLVar3->handler_desc_index = handler_desc_index;
    ppLVar1 = &(this->label_stack_).
               super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
  return;
}

Assistant:

void BinaryReaderInterp::PushLabel(LabelKind kind,
                                   Istream::Offset offset,
                                   Istream::Offset fixup_offset,
                                   u32 handler_desc_index) {
  label_stack_.push_back(Label{kind, offset, fixup_offset, handler_desc_index});
}